

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O0

void __thiscall ncnn::MultiHeadAttention_x86::MultiHeadAttention_x86(MultiHeadAttention_x86 *this)

{
  long *in_RDI;
  MultiHeadAttention *in_stack_00000040;
  
  MultiHeadAttention::MultiHeadAttention(in_stack_00000040);
  *in_RDI = (long)&PTR_create_pipeline_01d3ada0;
  in_RDI[8] = (long)&PTR__MultiHeadAttention_x86_01d3ae20;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[4] = 0;
  return;
}

Assistant:

MultiHeadAttention_x86::MultiHeadAttention_x86()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    q_gemm = 0;
    k_gemm = 0;
    v_gemm = 0;

    qk_gemm = 0;
    qkv_gemm = 0;

    qk_softmax = 0;

    o_gemm = 0;
}